

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::ReleaseMessage
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,
          MessageFactory *factory)

{
  Message *pMVar1;
  ExtensionSet *this_00;
  MessageLite *pMVar2;
  Message **ppMVar3;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseMessage",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"ReleaseMessage",CPPTYPE_MESSAGE);
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    if (factory == (MessageFactory *)0x0) {
      factory = this->message_factory_;
    }
    this_00 = MutableExtensionSet(this,message);
    pMVar2 = ExtensionSet::ReleaseMessage(this_00,field,factory);
    return (Message *)pMVar2;
  }
  ClearBit(this,message,field);
  ppMVar3 = MutableRaw<google::protobuf::Message*>(this,message,field);
  pMVar1 = *ppMVar3;
  *ppMVar3 = (Message *)0x0;
  return pMVar1;
}

Assistant:

Message* GeneratedMessageReflection::ReleaseMessage(
    Message* message,
    const FieldDescriptor* field,
    MessageFactory* factory) const {
  USAGE_CHECK_ALL(ReleaseMessage, SINGULAR, MESSAGE);

  if (factory == NULL) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->ReleaseMessage(field, factory));
  } else {
    ClearBit(message, field);
    Message** result = MutableRaw<Message*>(message, field);
    Message* ret = *result;
    *result = NULL;
    return ret;
  }
}